

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

QString * __thiscall
QWidgetLineControl::clearString
          (QString *__return_storage_ptr__,QWidgetLineControl *this,int pos,int len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = *(int *)(this + 0x60);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (0 < len && pos < iVar1) {
    iVar2 = len + pos;
    if (iVar1 < len + pos) {
      iVar2 = iVar1;
    }
    lVar3 = (long)pos;
    do {
      if (*(long *)(this + 0xe8) == 0) {
        clearString();
      }
      QString::append((QChar)(char16_t)__return_storage_ptr__);
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidgetLineControl::clearString(int pos, int len) const
{
    if (pos >= m_maxLength)
        return QString();

    QString s;
    int end = qMin(m_maxLength, pos + len);
    for (int i = pos; i < end; ++i)
        if (m_maskData[i].separator)
            s += m_maskData[i].maskChar;
        else
            s += m_blank;

    return s;
}